

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3StrAccumEnlarge(StrAccum *p,int N)

{
  sqlite3 *psVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (p->accError != '\0') {
    return 0;
  }
  uVar4 = (ulong)p->mxAlloc;
  if (uVar4 == 0) {
    setStrAccumError(p,'\x12');
    return ~p->nChar + p->nAlloc;
  }
  if ((p->printfFlags & 4) == 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = p->zText;
  }
  uVar6 = (long)N + (ulong)p->nChar * 2 + 1;
  uVar7 = (long)N + (ulong)p->nChar + 1;
  if ((long)uVar6 <= (long)uVar4) {
    uVar7 = uVar6;
  }
  if ((long)uVar4 < (long)uVar7) {
    sqlite3_str_reset(p);
    setStrAccumError(p,'\x12');
    return 0;
  }
  p->nAlloc = (u32)uVar7;
  if (p->db == (sqlite3 *)0x0) {
    iVar3 = sqlite3_initialize();
    if (iVar3 != 0) goto LAB_0011e83b;
    pcVar5 = (char *)sqlite3Realloc(pcVar5,uVar7 & 0xffffffff);
  }
  else {
    pcVar5 = (char *)sqlite3DbRealloc(p->db,pcVar5,uVar7 & 0xffffffff);
  }
  if (pcVar5 != (char *)0x0) {
    if (((p->printfFlags & 4) == 0) && ((ulong)p->nChar != 0)) {
      memcpy(pcVar5,p->zText,(ulong)p->nChar);
    }
    p->zText = pcVar5;
    psVar1 = p->db;
    if (((psVar1 == (sqlite3 *)0x0) || (pcVar5 < (psVar1->lookaside).pStart)) ||
       ((psVar1->lookaside).pEnd <= pcVar5)) {
      uVar2 = (*sqlite3Config.m.xSize)(pcVar5);
    }
    else {
      uVar2 = (uint)(psVar1->lookaside).sz;
    }
    p->nAlloc = uVar2;
    p->printfFlags = p->printfFlags | 4;
    return N;
  }
LAB_0011e83b:
  sqlite3_str_reset(p);
  p->accError = '\a';
  if (p->mxAlloc != 0) {
    sqlite3_str_reset(p);
  }
  return 0;
}

Assistant:

static int sqlite3StrAccumEnlarge(StrAccum *p, int N){
  char *zNew;
  assert( p->nChar+(i64)N >= p->nAlloc ); /* Only called if really needed */
  if( p->accError ){
    testcase(p->accError==SQLITE_TOOBIG);
    testcase(p->accError==SQLITE_NOMEM);
    return 0;
  }
  if( p->mxAlloc==0 ){
    setStrAccumError(p, SQLITE_TOOBIG);
    return p->nAlloc - p->nChar - 1;
  }else{
    char *zOld = isMalloced(p) ? p->zText : 0;
    i64 szNew = p->nChar;
    szNew += N + 1;
    if( szNew+p->nChar<=p->mxAlloc ){
      /* Force exponential buffer size growth as long as it does not overflow,
      ** to avoid having to call this routine too often */
      szNew += p->nChar;
    }
    if( szNew > p->mxAlloc ){
      sqlite3_str_reset(p);
      setStrAccumError(p, SQLITE_TOOBIG);
      return 0;
    }else{
      p->nAlloc = (int)szNew;
    }
    if( p->db ){
      zNew = sqlite3DbRealloc(p->db, zOld, p->nAlloc);
    }else{
      zNew = sqlite3_realloc64(zOld, p->nAlloc);
    }
    if( zNew ){
      assert( p->zText!=0 || p->nChar==0 );
      if( !isMalloced(p) && p->nChar>0 ) memcpy(zNew, p->zText, p->nChar);
      p->zText = zNew;
      p->nAlloc = sqlite3DbMallocSize(p->db, zNew);
      p->printfFlags |= SQLITE_PRINTF_MALLOCED;
    }else{
      sqlite3_str_reset(p);
      setStrAccumError(p, SQLITE_NOMEM);
      return 0;
    }
  }
  return N;
}